

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O3

int tnt_reply_hdr0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  ushort *puVar1;
  byte bVar2;
  bool bVar3;
  size_t *psVar4;
  size_t *psVar5;
  size_t *psVar6;
  uint uVar7;
  int iVar8;
  size_t *psVar9;
  size_t *psVar10;
  size_t *psVar11;
  size_t *psVar12;
  size_t *psVar13;
  ulong uVar14;
  long lVar15;
  long extraout_RDX;
  size_t size_00;
  uint *puVar16;
  size_t *end;
  int64_t iVar17;
  char **data;
  tnt_reply *r_00;
  uint64_t uVar18;
  ulong uVar19;
  uint64_t uVar20;
  ulong uVar21;
  ulong unaff_R12;
  ulong unaff_R13;
  size_t *psStack_128;
  size_t *psStack_120;
  size_t sStack_110;
  size_t sStack_108;
  size_t *psStack_100;
  size_t *psStack_f8;
  char **ppcStack_f0;
  code *pcStack_e8;
  size_t *psStack_e0;
  size_t *psStack_d8;
  char **ppcStack_d0;
  size_t *psStack_c8;
  size_t *psStack_c0;
  size_t *psStack_b8;
  size_t *psStack_b0;
  size_t *psStack_a8;
  size_t *psStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  size_t *psStack_80;
  size_t *psStack_78;
  ulong uStack_70;
  uint64_t uStack_68;
  char *pcStack_60;
  tnt_reply *ptStack_58;
  code *apcStack_50 [2];
  char *local_40;
  char *test;
  
  data = &local_40;
  apcStack_50[0] = (code *)0x105214;
  local_40 = buf;
  uVar7 = mp_check(data,buf + size);
  psVar13 = (size_t *)(ulong)uVar7;
  iVar8 = -1;
  if (uVar7 == 0) {
    bVar2 = *buf;
    psVar12 = (size_t *)(ulong)bVar2;
    if (mp_type_hint[(long)psVar12] != MP_MAP) {
      return -1;
    }
    if (bVar2 == 0xdf) {
      uVar7 = *(uint *)(buf + 1);
      psVar12 = (size_t *)
                (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                       uVar7 << 0x18);
      psVar13 = (size_t *)(buf + 5);
    }
    else if (bVar2 == 0xde) {
      psVar13 = (size_t *)(buf + 3);
      psVar12 = (size_t *)(ulong)(ushort)(*(ushort *)(buf + 1) << 8 | *(ushort *)(buf + 1) >> 8);
    }
    else {
      puVar16 = (uint *)off;
      if (-0x71 < (char)bVar2) {
LAB_001054b3:
        apcStack_50[0] = tnt_reply_body0;
        tnt_reply_hdr0_cold_5();
        end = (size_t *)((long)psVar12 + extraout_RDX);
        pcStack_e8 = (code *)0x1054e4;
        psVar10 = psVar13;
        psStack_e0 = psVar12;
        psStack_78 = (size_t *)puVar16;
        uStack_70 = unaff_R12;
        uStack_68 = unaff_R13;
        pcStack_60 = buf;
        ptStack_58 = r;
        apcStack_50[0] = (code *)&stack0xfffffffffffffff8;
        iVar8 = mp_check((char **)&psStack_e0,(char *)end);
        r_00 = (tnt_reply *)0xffffffff;
        if ((iVar8 == 0) && (bVar2 = (byte)*psVar12, mp_type_hint[bVar2] == MP_MAP)) {
          psStack_80 = (size_t *)((long)psVar12 + 1);
          if (bVar2 == 0xdf) {
            uVar7 = *(uint *)((long)psVar12 + 1);
            uVar19 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                            uVar7 << 0x18);
            psStack_80 = (size_t *)((long)psVar12 + 5);
          }
          else if (bVar2 == 0xde) {
            psStack_80 = (size_t *)((long)psVar12 + 3);
            uVar19 = (ulong)(ushort)(*(ushort *)((long)psVar12 + 1) << 8 |
                                    *(ushort *)((long)psVar12 + 1) >> 8);
          }
          else {
            if (-0x71 < (char)bVar2) {
LAB_00105a4a:
              pcStack_e8 = tnt_reply;
              tnt_reply_body0_cold_3();
              psStack_100 = psVar13;
              psStack_f8 = psVar12;
              ppcStack_f0 = data;
              pcStack_e8 = (code *)apcStack_50;
              iVar8 = tnt_reply_len((char *)end,size_00,&sStack_108);
              sStack_110 = sStack_108;
              if (iVar8 == 0) {
                if (r_00 == (tnt_reply *)0x0) {
                  iVar8 = 0;
                }
                else {
                  psStack_120 = &sStack_110;
                  sStack_110 = 0;
                  psStack_128 = end;
                  iVar8 = tnt_reply_from(r_00,tnt_reply_cb,&psStack_128);
                }
              }
              else {
                if (iVar8 != 1) {
                  return -1;
                }
                iVar8 = 1;
              }
              if (psVar10 != (size_t *)0x0) {
                *psVar10 = sStack_110;
              }
              return iVar8;
            }
            uVar19 = (ulong)(bVar2 & 0xf);
          }
          psStack_d8 = psVar13;
          ppcStack_d0 = data;
          psStack_c8 = psVar12;
          if ((int)uVar19 == 0) {
            end = (size_t *)0x0;
            psStack_c0 = (size_t *)0x0;
            psStack_b8 = (size_t *)0x0;
            psVar11 = (size_t *)0x0;
            psStack_b0 = (size_t *)0x0;
            psVar12 = (size_t *)0x0;
            psStack_a8 = (size_t *)0x0;
            psVar13 = (size_t *)0x0;
            uVar21 = 0;
          }
          else {
            uVar21 = 0;
            psVar13 = (size_t *)0x0;
            psStack_a8 = (size_t *)0x0;
            psVar12 = (size_t *)0x0;
            psStack_b0 = (size_t *)0x0;
            psVar11 = (size_t *)0x0;
            psStack_b8 = (size_t *)0x0;
            psStack_c0 = (size_t *)0x0;
            end = (size_t *)0x0;
            do {
              r_00 = (tnt_reply *)0xffffffff;
              bVar2 = (byte)*psStack_80;
              uVar14 = (ulong)bVar2;
              psVar9 = (size_t *)((long)psStack_80 + 1);
              psVar10 = (size_t *)(ulong)(bVar2 - 0xcc);
              switch(psVar10) {
              case (size_t *)0x0:
                uVar14 = (ulong)*(byte *)((long)psStack_80 + 1);
                psVar9 = (size_t *)((long)psStack_80 + 2);
                break;
              case (size_t *)0x1:
                psVar9 = (size_t *)((long)psStack_80 + 3);
                uVar14 = (ulong)(ushort)(*(ushort *)((long)psStack_80 + 1) << 8 |
                                        *(ushort *)((long)psStack_80 + 1) >> 8);
                break;
              case (size_t *)0x2:
                uVar7 = *(uint *)((long)psStack_80 + 1);
                uVar14 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                uVar7 << 0x18);
                psVar9 = (size_t *)((long)psStack_80 + 5);
                break;
              case (size_t *)0x3:
                uVar14 = *(ulong *)((long)psStack_80 + 1);
                uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                         (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                         (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                         (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                psVar9 = (size_t *)((long)psStack_80 + 9);
                break;
              default:
                if (-1 < (char)bVar2) break;
                pcStack_e8 = (code *)0x105a45;
                psStack_80 = psVar9;
                tnt_reply_body0_cold_2();
                goto LAB_00105a45;
              }
              iVar8 = (int)uVar14;
              psStack_80 = psVar9;
              psVar4 = psStack_b8;
              psVar5 = psStack_b0;
              psVar6 = psStack_a8;
              if (iVar8 < 0x32) {
                if (iVar8 == 0x30) {
                  if (mp_type_hint[(byte)*psVar9] != MP_ARRAY) goto LAB_00105a2f;
                  iVar17 = 1;
                  do {
                    psVar11 = (size_t *)((long)psStack_80 + 1);
                    lVar15 = (long)""[(byte)*psStack_80];
                    psVar4 = psVar9;
                    if (lVar15 < 0) {
                      if ((byte)*psStack_80 == 0xd9) {
                        psVar11 = (size_t *)
                                  ((long)psStack_80 + (ulong)*(byte *)((long)psStack_80 + 1) + 2);
                      }
                      else {
                        if ((byte)""[(byte)*psStack_80] < 0xe1) {
                          pcStack_e8 = (code *)0x10596c;
                          psStack_a0 = end;
                          uStack_98 = uVar14;
                          uStack_90 = uVar19;
                          uStack_88 = uVar21;
                          mp_next_slowpath((char **)&psStack_80,iVar17);
                          uVar14 = uStack_98;
                          end = psStack_a0;
                          uVar19 = uStack_90;
                          uVar21 = uStack_88;
                          psVar11 = psStack_80;
                          psVar5 = psStack_b0;
                          psVar6 = psStack_a8;
                          break;
                        }
                        iVar17 = iVar17 - lVar15;
                        uStack_90 = uVar19;
                        uStack_88 = uVar21;
                      }
                    }
                    else {
                      psVar11 = (size_t *)((long)psVar11 + lVar15);
                    }
                    bVar3 = 1 < iVar17;
                    iVar17 = iVar17 + -1;
                    psStack_80 = psVar11;
                    psStack_a0 = end;
                    uStack_98 = uVar14;
                  } while (bVar3);
                }
                else if (iVar8 == 0x31) {
                  bVar2 = (byte)*psVar9;
                  if (mp_type_hint[bVar2] != MP_STR) goto LAB_00105a2f;
                  end = (size_t *)((long)psVar9 + 1);
                  if (bVar2 == 0xdb) {
                    uVar7 = *(uint *)((long)psVar9 + 1);
                    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                            uVar7 << 0x18;
                    end = (size_t *)((long)psVar9 + 5);
                  }
                  else if (bVar2 == 0xda) {
                    end = (size_t *)((long)psVar9 + 3);
                    uVar7 = (uint)(ushort)(*(ushort *)((long)psVar9 + 1) << 8 |
                                          *(ushort *)((long)psVar9 + 1) >> 8);
                  }
                  else if (bVar2 == 0xd9) {
                    uVar7 = (uint)*(byte *)((long)psVar9 + 1);
                    end = (size_t *)((long)psVar9 + 2);
                  }
                  else {
                    psVar10 = (size_t *)(ulong)(bVar2 + 0x40);
                    psStack_80 = end;
                    if ((byte)(bVar2 + 0x40) < 0xe0) {
LAB_00105a45:
                      pcStack_e8 = (code *)0x105a4a;
                      tnt_reply_body0_cold_1();
                      data = (char **)"";
                      goto LAB_00105a4a;
                    }
                    uVar7 = bVar2 & 0x1f;
                  }
                  psStack_c0 = (size_t *)((ulong)uVar7 + (long)end);
                  psStack_80 = psStack_c0;
                }
                else {
LAB_0010571b:
                  iVar17 = 1;
                  do {
                    psVar10 = (size_t *)((long)psStack_80 + 1);
                    lVar15 = (long)""[(byte)*psStack_80];
                    if (lVar15 < 0) {
                      if ((byte)*psStack_80 == 0xd9) {
                        psVar10 = (size_t *)
                                  ((long)psStack_80 + (ulong)*(byte *)((long)psStack_80 + 1) + 2);
                      }
                      else {
                        if ((byte)""[(byte)*psStack_80] < 0xe1) {
                          pcStack_e8 = (code *)0x10593c;
                          psStack_a0 = end;
                          uStack_98 = uVar14;
                          uStack_90 = uVar19;
                          uStack_88 = uVar21;
                          mp_next_slowpath((char **)&psStack_80,iVar17);
                          uVar14 = uStack_98;
                          end = psStack_a0;
                          uVar19 = uStack_90;
                          uVar21 = uStack_88;
                          psVar4 = psStack_b8;
                          psVar5 = psStack_b0;
                          psVar6 = psStack_a8;
                          break;
                        }
                        iVar17 = iVar17 - lVar15;
                        uStack_90 = uVar19;
                        uStack_88 = uVar21;
                      }
                    }
                    else {
                      psVar10 = (size_t *)((long)psVar10 + lVar15);
                    }
                    bVar3 = 1 < iVar17;
                    iVar17 = iVar17 + -1;
                    psStack_80 = psVar10;
                    psStack_a0 = end;
                    uStack_98 = uVar14;
                  } while (bVar3);
                }
              }
              else if (iVar8 == 0x32) {
                if (mp_type_hint[(byte)*psVar9] != MP_ARRAY) goto LAB_00105a2f;
                iVar17 = 1;
                do {
                  psVar12 = (size_t *)((long)psStack_80 + 1);
                  lVar15 = (long)""[(byte)*psStack_80];
                  psVar5 = psVar9;
                  if (lVar15 < 0) {
                    if ((byte)*psStack_80 == 0xd9) {
                      psVar12 = (size_t *)
                                ((long)psStack_80 + (ulong)*(byte *)((long)psStack_80 + 1) + 2);
                    }
                    else {
                      if ((byte)""[(byte)*psStack_80] < 0xe1) {
                        pcStack_e8 = (code *)0x105988;
                        psStack_a0 = end;
                        uStack_98 = uVar14;
                        uStack_90 = uVar19;
                        uStack_88 = uVar21;
                        mp_next_slowpath((char **)&psStack_80,iVar17);
                        uVar14 = uStack_98;
                        end = psStack_a0;
                        uVar19 = uStack_90;
                        uVar21 = uStack_88;
                        psVar12 = psStack_80;
                        psVar4 = psStack_b8;
                        psVar6 = psStack_a8;
                        break;
                      }
                      iVar17 = iVar17 - lVar15;
                      uStack_90 = uVar19;
                      uStack_88 = uVar21;
                    }
                  }
                  else {
                    psVar12 = (size_t *)((long)psVar12 + lVar15);
                  }
                  bVar3 = 1 < iVar17;
                  iVar17 = iVar17 + -1;
                  psStack_80 = psVar12;
                  psStack_a0 = end;
                  uStack_98 = uVar14;
                } while (bVar3);
              }
              else {
                if (iVar8 != 0x42) goto LAB_0010571b;
                if (mp_type_hint[(byte)*psVar9] != MP_MAP) goto LAB_00105a2f;
                iVar17 = 1;
                do {
                  psVar13 = (size_t *)((long)psStack_80 + 1);
                  lVar15 = (long)""[(byte)*psStack_80];
                  psVar6 = psVar9;
                  if (lVar15 < 0) {
                    if ((byte)*psStack_80 == 0xd9) {
                      psVar13 = (size_t *)
                                ((long)psStack_80 + (ulong)*(byte *)((long)psStack_80 + 1) + 2);
                    }
                    else {
                      if ((byte)""[(byte)*psStack_80] < 0xe1) {
                        pcStack_e8 = (code *)0x105950;
                        psStack_a0 = end;
                        uStack_98 = uVar14;
                        uStack_90 = uVar19;
                        uStack_88 = uVar21;
                        mp_next_slowpath((char **)&psStack_80,iVar17);
                        uVar14 = uStack_98;
                        psVar13 = psStack_80;
                        end = psStack_a0;
                        uVar19 = uStack_90;
                        uVar21 = uStack_88;
                        psVar4 = psStack_b8;
                        psVar5 = psStack_b0;
                        break;
                      }
                      iVar17 = iVar17 - lVar15;
                      uStack_90 = uVar19;
                      uStack_88 = uVar21;
                    }
                  }
                  else {
                    psVar13 = (size_t *)((long)psVar13 + lVar15);
                  }
                  bVar3 = 1 < iVar17;
                  psStack_80 = psVar13;
                  iVar17 = iVar17 + -1;
                  psStack_a0 = end;
                  uStack_98 = uVar14;
                } while (bVar3);
              }
              psStack_a8 = psVar6;
              psStack_b0 = psVar5;
              psStack_b8 = psVar4;
              uVar7 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar7;
              uVar21 = uVar21 | 1L << (uVar14 & 0x3f);
            } while (uVar7 != 0);
          }
          if (ppcStack_d0 != (char **)0x0) {
            ppcStack_d0[7] = (char *)end;
            ppcStack_d0[8] = (char *)psStack_c0;
            ppcStack_d0[9] = (char *)psStack_b8;
            ppcStack_d0[10] = (char *)psVar11;
            ppcStack_d0[0xb] = (char *)psStack_b0;
            ppcStack_d0[0xc] = (char *)psVar12;
            ppcStack_d0[0xd] = (char *)psStack_a8;
            ppcStack_d0[0xe] = (char *)psVar13;
            ppcStack_d0[1] = (char *)((ulong)ppcStack_d0[1] | uVar21);
          }
          r_00 = (tnt_reply *)0x0;
          if (psStack_d8 != (size_t *)0x0) {
            *psStack_d8 = (long)psStack_80 - (long)psStack_c8;
          }
        }
LAB_00105a2f:
        return (int)r_00;
      }
      psVar13 = (size_t *)(buf + 1);
      psVar12 = (size_t *)(ulong)(bVar2 & 0xf);
    }
    if ((int)psVar12 == 0) {
      unaff_R13 = 0;
      uVar20 = 0;
      uVar18 = 0;
      data = (char **)0x0;
    }
    else {
      data = (char **)0x0;
      uVar18 = 0;
      uVar19 = 0;
      unaff_R13 = 0;
      puVar16 = &switchD_00105344::switchdataD_001191cc;
      do {
        bVar2 = (byte)*psVar13;
        uVar21 = (ulong)bVar2;
        if (mp_type_hint[uVar21] != MP_UINT) {
          return -1;
        }
        unaff_R12 = (ulong)(bVar2 - 0xcc);
        test = (char *)off;
        switch(unaff_R12) {
        case 0:
          uVar21 = (ulong)*(byte *)((long)psVar13 + 1);
          psVar13 = (size_t *)((long)psVar13 + 2);
          break;
        case 1:
          puVar1 = (ushort *)((long)psVar13 + 1);
          psVar13 = (size_t *)((long)psVar13 + 3);
          uVar21 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
          break;
        case 2:
          uVar7 = *(uint *)((long)psVar13 + 1);
          uVar21 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18);
          psVar13 = (size_t *)((long)psVar13 + 5);
          break;
        case 3:
          uVar21 = *(ulong *)((long)psVar13 + 1);
          uVar21 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                   (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8;
          psVar13 = (size_t *)((long)psVar13 + 9);
          break;
        default:
          if (-1 < (char)bVar2) {
            psVar13 = (size_t *)((long)psVar13 + 1);
            break;
          }
          apcStack_50[0] = (code *)0x1054a4;
          tnt_reply_hdr0_cold_4();
          goto LAB_001054a4;
        }
        bVar2 = (byte)*psVar13;
        unaff_R12 = (ulong)bVar2;
        if (mp_type_hint[unaff_R12] != MP_UINT) {
          return -1;
        }
        iVar8 = (int)uVar21;
        if (iVar8 == 0) {
          switch(bVar2) {
          case 0xcc:
            uVar19 = (ulong)*(byte *)((long)psVar13 + 1);
            goto LAB_001053a0;
          case 0xcd:
            puVar1 = (ushort *)((long)psVar13 + 1);
            psVar13 = (size_t *)((long)psVar13 + 3);
            uVar19 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case 0xce:
            uVar19 = (ulong)(*(uint *)((long)psVar13 + 1) >> 0x18 |
                            (*(uint *)((long)psVar13 + 1) & 0xff0000) >> 8);
            goto LAB_001053df;
          case 0xcf:
            uVar19 = *(ulong *)((long)psVar13 + 1) >> 0x38 |
                     (*(ulong *)((long)psVar13 + 1) & 0xff000000000000) >> 0x28;
            goto LAB_00105409;
          default:
            if ((char)bVar2 < '\0') {
LAB_001054a9:
              apcStack_50[0] = (code *)0x1054ae;
              tnt_reply_hdr0_cold_2();
LAB_001054ae:
              apcStack_50[0] = (code *)0x1054b3;
              tnt_reply_hdr0_cold_3();
              goto LAB_001054b3;
            }
            psVar13 = (size_t *)((long)psVar13 + 1);
            uVar19 = unaff_R12;
          }
        }
        else if (iVar8 == 5) {
          switch(bVar2) {
          case 0xcc:
            uVar18 = (uint64_t)*(byte *)((long)psVar13 + 1);
            goto LAB_001053a0;
          case 0xcd:
            puVar1 = (ushort *)((long)psVar13 + 1);
            psVar13 = (size_t *)((long)psVar13 + 3);
            uVar18 = (uint64_t)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case 0xce:
            uVar7 = *(uint *)((long)psVar13 + 1);
            uVar18 = (uint64_t)
                     (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                     uVar7 << 0x18);
            goto LAB_001053df;
          case 0xcf:
            uVar14 = *(ulong *)((long)psVar13 + 1);
            uVar18 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                     (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                     (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                     (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
            goto LAB_00105409;
          default:
            if ((char)bVar2 < '\0') {
LAB_001054a4:
              apcStack_50[0] = (code *)0x1054a9;
              tnt_reply_hdr0_cold_1();
              goto LAB_001054a9;
            }
            psVar13 = (size_t *)((long)psVar13 + 1);
            uVar18 = unaff_R12;
          }
        }
        else {
          if (iVar8 != 1) {
            return -1;
          }
          unaff_R13 = (ulong)(bVar2 - 0xcc);
          switch(unaff_R13) {
          case 0:
            unaff_R13 = (ulong)*(byte *)((long)psVar13 + 1);
LAB_001053a0:
            psVar13 = (size_t *)((long)psVar13 + 2);
            break;
          case 1:
            puVar1 = (ushort *)((long)psVar13 + 1);
            psVar13 = (size_t *)((long)psVar13 + 3);
            unaff_R13 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case 2:
            uVar7 = *(uint *)((long)psVar13 + 1);
            unaff_R13 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                               uVar7 << 0x18);
LAB_001053df:
            psVar13 = (size_t *)((long)psVar13 + 5);
            break;
          case 3:
            uVar14 = *(ulong *)((long)psVar13 + 1);
            unaff_R13 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                        (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                        (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                        (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
LAB_00105409:
            psVar13 = (size_t *)((long)psVar13 + 9);
            break;
          default:
            if ((char)bVar2 < '\0') goto LAB_001054ae;
            psVar13 = (size_t *)((long)psVar13 + 1);
            unaff_R13 = unaff_R12;
          }
        }
        uVar7 = (int)psVar12 - 1;
        psVar12 = (size_t *)(ulong)uVar7;
        data = (char **)((ulong)data | 1L << (uVar21 & 0x3f));
      } while (uVar7 != 0);
      uVar20 = (uint64_t)((uint)uVar19 & 0x7fff);
    }
    if (r != (tnt_reply *)0x0) {
      r->sync = unaff_R13;
      r->code = uVar20;
      r->schema_id = uVar18;
      r->bitmap = (uint64_t)data;
    }
    iVar8 = 0;
    if (off != (size_t *)0x0) {
      *off = (long)psVar13 - (long)buf;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int
tnt_reply_hdr0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;

	uint32_t n = mp_decode_map(&p);
	uint64_t sync = 0, code = 0, schema_id = 0, bitmap = 0;
	while (n-- > 0) {
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		uint32_t key = mp_decode_uint(&p);
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		switch (key) {
		case TNT_SYNC:
			sync = mp_decode_uint(&p);
			break;
		case TNT_CODE:
			code = mp_decode_uint(&p);
			break;
		case TNT_SCHEMA_ID:
			schema_id = mp_decode_uint(&p);
			break;
		default:
			return -1;
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->sync = sync;
		r->code = code & ((1 << 15) - 1);
		r->schema_id = schema_id;
		r->bitmap = bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}